

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::debugDrawObject
          (cbtCollisionWorld *this,cbtTransform *worldTransform,cbtCollisionShape *shape,
          cbtVector3 *color)

{
  undefined8 *puVar1;
  uint uVar2;
  cbtScalar cVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar14;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  long lVar15;
  int iVar16;
  code *UNRECOVERED_JUMPTABLE;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int v;
  long lVar20;
  long lVar21;
  undefined1 auVar24 [16];
  undefined8 uVar37;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ulong uVar22;
  ulong uVar23;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var_14 [56];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 extraout_var_15 [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar39 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined1 auVar40 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_16 [56];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 extraout_var_19 [56];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 extraout_var_20 [56];
  float fVar50;
  undefined8 in_XMM2_Qa;
  undefined1 auVar51 [16];
  cbtVector3 cVar52;
  float local_158;
  float fStack_154;
  cbtConcaveShape *concaveMesh;
  cbtVector3 wa;
  cbtVector3 wb;
  cbtVector3 a;
  float local_a8;
  float fStack_a4;
  cbtVector3 b;
  cbtVector3 local_40;
  undefined4 extraout_var_05;
  undefined1 auVar38 [56];
  undefined1 auVar49 [56];
  
  iVar10 = (*this->_vptr_cbtCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar10) != 0) {
    iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
    auVar51 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar10) + 0x70))
                        ((long *)CONCAT44(extraout_var_00,iVar10));
    in_ZMM1._0_8_ = auVar51._8_8_;
    in_ZMM0._0_8_ = auVar51._0_8_;
    in_ZMM1._8_56_ = extraout_var_16;
    in_ZMM0._8_56_ = extraout_var_14;
  }
  auVar38 = in_ZMM1._8_56_;
  auVar49 = in_ZMM0._8_56_;
  iVar10 = shape->m_shapeType;
  switch(iVar10) {
  case 8:
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x30);
    (*UNRECOVERED_JUMPTABLE)
              (in_ZMM0._0_4_,(long *)CONCAT44(extraout_var_01,iVar10),worldTransform,color,
               UNRECOVERED_JUMPTABLE);
    return;
  case 9:
    a.m_floats[0] = 1.0;
    a.m_floats[1] = 0.0;
    a.m_floats[2] = 0.0;
    a.m_floats[3] = 0.0;
    uVar19 = (ulong)*(uint *)&shape[3].field_0xc;
    lVar21 = uVar19 * 4;
    while( true ) {
      lVar21 = lVar21 + -4;
      if ((int)uVar19 < 1) break;
      iVar10 = (*this->_vptr_cbtCollisionWorld[5])();
      uVar4 = *(undefined4 *)(*(long *)&shape[4].m_userIndex + lVar21);
      cbtTransform::operator*((cbtTransform *)&b,worldTransform,(cbtTransform *)&a);
      (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar10) + 0x30))
                (uVar4,(long *)CONCAT44(extraout_var_06,iVar10),(cbtTransform *)&b,color);
      uVar19 = (ulong)((int)uVar19 - 1);
    }
    return;
  case 10:
    iVar10 = *(int *)((long)&shape[2]._vptr_cbtCollisionShape + 4);
    uVar19 = (ulong)iVar10;
    cVar3 = *(cbtScalar *)(&shape[1].field_0xc + uVar19 * 4);
    uVar12 = *(uint *)(&shape[1].field_0xc + (long)((iVar10 + 2) % 3) * 4);
    iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar14 = (long *)CONCAT44(extraout_var_05,iVar10);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar14 + 0xa8);
    break;
  case 0xb:
    uVar12 = shape[2].m_shapeType;
    uVar2 = *(uint *)&shape[2].field_0xc;
    uVar6 = *(uint *)((long)&shape[2].m_userPointer + 4);
    iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar14 = (long *)CONCAT44(extraout_var_09,iVar10);
    uVar22 = (ulong)uVar12;
    uVar23 = (ulong)uVar2;
    uVar19 = (ulong)uVar6;
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar14 + 0xb8);
    goto LAB_00de34ad;
  case 0xd:
    uVar19 = (ulong)*(int *)((long)&shape[2]._vptr_cbtCollisionShape + 4);
    (*shape->_vptr_cbtCollisionShape[0x17])(shape);
    auVar49 = in_ZMM0._8_56_;
    uVar12 = in_ZMM0._0_4_;
    cVar52 = cbtCylinderShape::getHalfExtentsWithMargin((cbtCylinderShape *)shape);
    auVar45._0_8_ = cVar52.m_floats._8_8_;
    auVar45._8_56_ = auVar38;
    auVar33._0_8_ = cVar52.m_floats._0_8_;
    auVar33._8_56_ = auVar49;
    auVar51 = vmovlhps_avx(auVar33._0_16_,auVar45._0_16_);
    a.m_floats[0] = auVar51._0_4_;
    a.m_floats[1] = auVar51._4_4_;
    a.m_floats[2] = auVar51._8_4_;
    a.m_floats[3] = auVar51._12_4_;
    cVar3 = a.m_floats[uVar19];
    iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar14 = (long *)CONCAT44(extraout_var_10,iVar10);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar14 + 0xb0);
    break;
  case 0x14:
    cVar52 = cbtCylindricalShellShape::getHalfExtentsWithMargin((cbtCylindricalShellShape *)shape);
    uVar22 = cVar52.m_floats._0_8_;
    cVar52 = cbtCylindricalShellShape::getHalfExtentsWithMargin((cbtCylindricalShellShape *)shape);
    auVar32._0_8_ = cVar52.m_floats._0_8_;
    auVar32._8_56_ = auVar49;
    auVar51 = vmovshdup_avx(auVar32._0_16_);
    uVar23 = auVar51._0_8_;
    iVar10 = (*this->_vptr_cbtCollisionWorld[5])(uVar23,cVar52.m_floats._8_8_,this);
    plVar14 = (long *)CONCAT44(extraout_var_08,iVar10);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar14 + 0xb0);
    uVar19 = 1;
    goto LAB_00de34ad;
  case 0x17:
    pauVar8 = (undefined1 (*) [16])shape[2].m_userPointer;
    pauVar9 = *(undefined1 (**) [16])&shape[2].m_userIndex;
    fVar50 = (worldTransform->m_origin).m_floats[2];
    auVar51 = vcvtpd2ps_avx(**(undefined1 (**) [16])&shape[2].m_shapeType);
    uVar7 = vmovlps_avx(auVar51);
    b.m_floats[2] = (float)*(double *)(*(undefined1 (**) [16])&shape[2].m_shapeType)[1];
    b.m_floats[0] = (cbtScalar)(int)uVar7;
    b.m_floats[1] = (cbtScalar)(int)((ulong)uVar7 >> 0x20);
    b.m_floats[3] = 0.0;
    uVar7 = *(undefined8 *)(worldTransform->m_origin).m_floats;
    uVar37 = 0;
    cVar52 = ::operator*(&worldTransform->m_basis,&b);
    local_158 = (float)uVar7;
    fStack_154 = (float)((ulong)uVar7 >> 0x20);
    auVar25._0_4_ = cVar52.m_floats[0] + local_158;
    auVar25._4_4_ = cVar52.m_floats[1] + fStack_154;
    auVar25._8_4_ = (float)uVar37 + 0.0;
    auVar25._12_4_ = (float)((ulong)uVar37 >> 0x20) + 0.0;
    auVar51 = vinsertps_avx(auVar25,ZEXT416((uint)(cVar52.m_floats[2] + fVar50)),0x28);
    a.m_floats[0] = auVar51._0_4_;
    a.m_floats[1] = auVar51._4_4_;
    a.m_floats[2] = auVar51._8_4_;
    a.m_floats[3] = auVar51._12_4_;
    auVar51 = vcvtpd2ps_avx(*pauVar8);
    uVar7 = vmovlps_avx(auVar51);
    wa.m_floats[2] = (float)*(double *)pauVar8[1];
    wa.m_floats[0] = (cbtScalar)(int)uVar7;
    wa.m_floats[1] = (cbtScalar)(int)((ulong)uVar7 >> 0x20);
    wa.m_floats[3] = 0.0;
    uVar37 = in_XMM2_Qa;
    cVar52 = ::operator*(&worldTransform->m_basis,&wa);
    auVar26._0_4_ = cVar52.m_floats[0] + local_158;
    auVar26._4_4_ = cVar52.m_floats[1] + fStack_154;
    auVar26._8_4_ = (float)in_XMM2_Qa + 0.0;
    auVar26._12_4_ = (float)((ulong)in_XMM2_Qa >> 0x20) + 0.0;
    b.m_floats = (cbtScalar  [4])
                 vinsertps_avx(auVar26,ZEXT416((uint)(cVar52.m_floats[2] + fVar50)),0x28);
    auVar51 = vcvtpd2ps_avx(*pauVar9);
    uVar7 = vmovlps_avx(auVar51);
    wb.m_floats[2] = (float)*(double *)pauVar9[1];
    wb.m_floats[0] = (cbtScalar)(int)uVar7;
    wb.m_floats[1] = (cbtScalar)(int)((ulong)uVar7 >> 0x20);
    wb.m_floats[3] = 0.0;
    cVar52 = ::operator*(&worldTransform->m_basis,&wb);
    auVar27._0_4_ = cVar52.m_floats[0] + local_158;
    auVar27._4_4_ = cVar52.m_floats[1] + fStack_154;
    auVar27._8_4_ = (float)uVar37 + 0.0;
    auVar27._12_4_ = (float)((ulong)uVar37 >> 0x20) + 0.0;
    wa.m_floats = (cbtScalar  [4])
                  vinsertps_avx(auVar27,ZEXT416((uint)(cVar52.m_floats[2] + fVar50)),0x28);
    iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar10) + 0x48))
              (0x3f800000,(long *)CONCAT44(extraout_var_07,iVar10),&a,&b,&wa,color);
    return;
  default:
    if (iVar10 == 0) {
      cVar52 = cbtBoxShape::getHalfExtentsWithMargin((cbtBoxShape *)shape);
      auVar46._0_8_ = cVar52.m_floats._8_8_;
      auVar46._8_56_ = auVar38;
      auVar34._0_8_ = cVar52.m_floats._0_8_;
      auVar34._8_56_ = auVar49;
      auVar51 = vmovlhps_avx(auVar34._0_16_,auVar46._0_16_);
      a.m_floats[0] = auVar51._0_4_;
      a.m_floats[1] = auVar51._4_4_;
      a.m_floats[2] = auVar51._8_4_;
      a.m_floats[3] = auVar51._12_4_;
      iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
      auVar40._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar40._8_4_ = auVar49._0_4_ ^ 0x80000000;
      auVar40._12_4_ = auVar49._4_4_ ^ 0x80000000;
      auVar51._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
      auVar51._8_4_ = auVar38._0_4_ ^ 0x80000000;
      auVar51._12_4_ = auVar38._4_4_ ^ 0x80000000;
      b.m_floats = (cbtScalar  [4])vinsertps_avx(auVar40,auVar51,0x28);
      (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar10) + 0xa0))
                ((long *)CONCAT44(extraout_var_12,iVar10),&b,&a,worldTransform,color);
      return;
    }
    if (iVar10 == 0x22) {
      uVar4 = *(undefined4 *)&shape[2].m_userPointer;
      iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_11,iVar10) + 0xc0);
      (*UNRECOVERED_JUMPTABLE)
                (uVar4,(long *)CONCAT44(extraout_var_11,iVar10),shape + 2,worldTransform,color,
                 UNRECOVERED_JUMPTABLE);
      return;
    }
    if (iVar10 == 0x25) {
      uVar19 = (ulong)*(uint *)((long)&shape[1]._vptr_cbtCollisionShape + 4);
      lVar21 = uVar19 * 0x58 + -0x18;
      for (; 0 < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 1)) {
        puVar1 = (undefined8 *)((long)shape[1].m_userPointer + lVar21 + -0x40);
        uVar7 = *puVar1;
        uVar37 = puVar1[1];
        a.m_floats[0] = (cbtScalar)uVar7;
        a.m_floats[1] = (cbtScalar)((ulong)uVar7 >> 0x20);
        a.m_floats[2] = (cbtScalar)uVar37;
        a.m_floats[3] = (cbtScalar)((ulong)uVar37 >> 0x20);
        uVar7 = *(undefined8 *)((long)shape[1].m_userPointer + lVar21);
        cbtTransform::operator*((cbtTransform *)&b,worldTransform,(cbtTransform *)&a);
        (*this->_vptr_cbtCollisionWorld[7])(this,(cbtTransform *)&b,uVar7,color);
        lVar21 = lVar21 + -0x58;
      }
      return;
    }
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
    if (iVar10 < 7) {
      lVar21 = *(long *)&shape[2].m_shapeType;
      if (lVar21 == 0) {
        uVar12 = 0;
        while( true ) {
          auVar38 = in_ZMM1._8_56_;
          auVar49 = in_ZMM0._8_56_;
          iVar10 = (*shape->_vptr_cbtCollisionShape[0x1a])(shape);
          if (iVar10 <= (int)uVar12) break;
          (*shape->_vptr_cbtCollisionShape[0x1b])(shape,(ulong)uVar12,&a,&b);
          cVar52 = cbtTransform::operator()(worldTransform,&a);
          auVar47._0_8_ = cVar52.m_floats._8_8_;
          auVar47._8_56_ = auVar38;
          auVar35._0_8_ = cVar52.m_floats._0_8_;
          auVar35._8_56_ = auVar49;
          wa.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar35._0_16_,auVar47._0_16_);
          auVar49 = ZEXT856(wa.m_floats._8_8_);
          cVar52 = cbtTransform::operator()(worldTransform,&b);
          auVar48._0_8_ = cVar52.m_floats._8_8_;
          auVar48._8_56_ = auVar38;
          auVar36._0_8_ = cVar52.m_floats._0_8_;
          auVar36._8_56_ = auVar49;
          wb.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar36._0_16_,auVar48._0_16_);
          iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
          auVar51 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar10) + 0x20))
                              ((long *)CONCAT44(extraout_var_13,iVar10),&wa,&wb,color);
          in_ZMM1._0_8_ = auVar51._8_8_;
          in_ZMM0._0_8_ = auVar51._0_8_;
          in_ZMM1._8_56_ = extraout_var_20;
          in_ZMM0._8_56_ = extraout_var_15;
          uVar12 = uVar12 + 1;
        }
      }
      else {
        for (lVar18 = 0; lVar18 < *(int *)(lVar21 + 0x2c); lVar18 = lVar18 + 1) {
          lVar15 = lVar18 * 0x30;
          a.m_floats[0] = 0.0;
          a.m_floats[1] = 0.0;
          a.m_floats[2] = 0.0;
          a.m_floats[3] = 0.0;
          lVar13 = *(long *)(lVar21 + 0x38);
          iVar10 = *(int *)(lVar13 + 4 + lVar15);
          if ((long)iVar10 == 0) {
            a.m_floats[0] = 0.0;
            a.m_floats[1] = 0.0;
            a.m_floats[2] = 0.0;
          }
          else {
            iVar16 = *(int *)(*(long *)(lVar13 + lVar15 + 0x10) + -4 + (long)iVar10 * 4);
            iVar11 = iVar10;
            for (lVar20 = 0; auVar49 = in_ZMM1._8_56_, lVar20 < iVar11; lVar20 = lVar20 + 1) {
              iVar5 = *(int *)(*(long *)(lVar13 + 0x10 + lVar15) + lVar20 * 4);
              lVar13 = *(long *)(lVar21 + 0x18);
              lVar17 = (long)iVar5 * 0x10;
              a.m_floats[0] = *(float *)(lVar13 + lVar17) + a.m_floats[0];
              a.m_floats[1] = *(float *)(lVar13 + 4 + lVar17) + a.m_floats[1];
              a.m_floats[2] = *(float *)(lVar13 + 8 + lVar17) + a.m_floats[2];
              auVar38 = (undefined1  [56])0x0;
              iVar11 = (*this->_vptr_cbtCollisionWorld[5])();
              cVar52 = cbtTransform::operator()
                                 (worldTransform,
                                  (cbtVector3 *)((long)iVar16 * 0x10 + *(long *)(lVar21 + 0x18)));
              auVar41._0_8_ = cVar52.m_floats._8_8_;
              auVar41._8_56_ = auVar49;
              auVar28._0_8_ = cVar52.m_floats._0_8_;
              auVar28._8_56_ = auVar38;
              b.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar28._0_16_,auVar41._0_16_);
              auVar38 = ZEXT856(b.m_floats._8_8_);
              cVar52 = cbtTransform::operator()
                                 (worldTransform,(cbtVector3 *)(lVar17 + *(long *)(lVar21 + 0x18)));
              auVar42._0_8_ = cVar52.m_floats._8_8_;
              auVar42._8_56_ = auVar49;
              auVar29._0_8_ = cVar52.m_floats._0_8_;
              auVar29._8_56_ = auVar38;
              wa.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar29._0_16_,auVar42._0_16_);
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar11) + 0x20))
                        ((long *)CONCAT44(extraout_var_02,iVar11),&b,&wa,color);
              in_ZMM1._8_56_ = extraout_var_17;
              in_ZMM1._0_8_ = extraout_XMM1_Qa;
              lVar13 = *(long *)(lVar21 + 0x38);
              iVar11 = *(int *)(lVar13 + 4 + lVar15);
              iVar16 = iVar5;
            }
          }
          fVar50 = 1.0 / (float)iVar10;
          a.m_floats[2] = fVar50 * a.m_floats[2];
          auVar39._0_4_ = fVar50 * a.m_floats[0];
          auVar39._4_4_ = fVar50 * a.m_floats[1];
          auVar39._8_4_ = fVar50 * 0.0;
          auVar39._12_4_ = fVar50 * 0.0;
          uVar7 = vmovlps_avx(auVar39);
          a.m_floats[0] = (cbtScalar)uVar7;
          a.m_floats[1] = (cbtScalar)((ulong)uVar7 >> 0x20);
          iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
          uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar10) + 0x70))
                             ((long *)CONCAT44(extraout_var_03,iVar10));
          in_ZMM1._8_56_ = extraout_var_18;
          in_ZMM1._0_8_ = extraout_XMM1_Qa_00;
          if ((uVar12 >> 0xe & 1) != 0) {
            b.m_floats = (cbtScalar  [4])ZEXT816(0x3f8000003f800000);
            fVar50 = *(float *)(*(long *)(lVar21 + 0x38) + 0x28 + lVar15);
            auVar49 = (undefined1  [56])0x0;
            uVar7 = *(undefined8 *)(*(long *)(lVar21 + 0x38) + 0x20 + lVar15);
            auVar38 = ZEXT856(0);
            iVar10 = (*this->_vptr_cbtCollisionWorld[5])(this);
            cVar52 = cbtTransform::operator()(worldTransform,&a);
            auVar43._0_8_ = cVar52.m_floats._8_8_;
            auVar43._8_56_ = auVar38;
            auVar30._0_8_ = cVar52.m_floats._0_8_;
            auVar30._8_56_ = auVar49;
            wa.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar30._0_16_,auVar43._0_16_);
            auVar38 = (undefined1  [56])0x0;
            local_a8 = (float)uVar7;
            fStack_a4 = (float)((ulong)uVar7 >> 0x20);
            auVar24._0_4_ = a.m_floats[0] + local_a8;
            auVar24._4_4_ = a.m_floats[1] + fStack_a4;
            auVar24._8_8_ = 0;
            local_40.m_floats =
                 (cbtScalar  [4])vinsertps_avx(auVar24,ZEXT416((uint)(fVar50 + a.m_floats[2])),0x28)
            ;
            auVar49 = ZEXT856(local_40.m_floats._8_8_);
            cVar52 = cbtTransform::operator()(worldTransform,&local_40);
            auVar44._0_8_ = cVar52.m_floats._8_8_;
            auVar44._8_56_ = auVar38;
            auVar31._0_8_ = cVar52.m_floats._0_8_;
            auVar31._8_56_ = auVar49;
            wb.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar31._0_16_,auVar44._0_16_);
            (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar10) + 0x20))
                      ((long *)CONCAT44(extraout_var_04,iVar10),&wa,&wb,&b);
            in_ZMM1._8_56_ = extraout_var_19;
            in_ZMM1._0_8_ = extraout_XMM1_Qa_01;
          }
        }
      }
    }
    iVar10 = shape->m_shapeType;
    if (iVar10 - 0x19U < 0xb) {
      b.m_floats[2] = 1e+18;
      b.m_floats[3] = 0.0;
      b.m_floats[0] = 1e+18;
      b.m_floats[1] = 1e+18;
      wa.m_floats[2] = -1e+18;
      wa.m_floats[3] = 0.0;
      wa.m_floats[0] = -1e+18;
      wa.m_floats[1] = -1e+18;
      (*this->_vptr_cbtCollisionWorld[5])(this);
      a.m_floats[0] = 2.8148454e-38;
      a.m_floats[1] = 0.0;
      a.m_floats[2] = 2.8148589e-38;
      a.m_floats[3] = 0.0;
      (*shape->_vptr_cbtCollisionShape[0x10])(shape,&a,&wa,&b);
      DebugDrawcallback::~DebugDrawcallback((DebugDrawcallback *)&a);
      iVar10 = shape->m_shapeType;
    }
    if (iVar10 == 3) {
      b.m_floats[2] = 1e+18;
      b.m_floats[3] = 0.0;
      b.m_floats[0] = 1e+18;
      b.m_floats[1] = 1e+18;
      wa.m_floats[2] = -1e+18;
      wa.m_floats[3] = 0.0;
      wa.m_floats[0] = -1e+18;
      wa.m_floats[1] = -1e+18;
      (*this->_vptr_cbtCollisionWorld[5])();
      a.m_floats[0] = 2.8148454e-38;
      a.m_floats[1] = 0.0;
      a.m_floats[2] = 2.8148589e-38;
      a.m_floats[3] = 0.0;
      (**(code **)(**(long **)&shape[3].m_userIndex + 0x10))
                (*(long **)&shape[3].m_userIndex,a.m_floats + 2,&wa,&b);
      DebugDrawcallback::~DebugDrawcallback((DebugDrawcallback *)&a);
    }
    return;
  }
  uVar22 = (ulong)uVar12;
  uVar23 = (ulong)(uint)cVar3;
  uVar19 = uVar19 & 0xffffffff;
LAB_00de34ad:
  (*UNRECOVERED_JUMPTABLE)(uVar22,uVar23,plVar14,uVar19,worldTransform,color,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void cbtCollisionWorld::debugDrawObject(const cbtTransform& worldTransform, const cbtCollisionShape* shape, const cbtVector3& color)
{
	// Draw a small simplex at the center of the object
	if (getDebugDrawer() && getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawFrames)
	{
        /* ***CHRONO*** Comment out */
		////getDebugDrawer()->drawTransform(worldTransform, .1);
	}

	if (shape->getShapeType() == COMPOUND_SHAPE_PROXYTYPE)
	{
		const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(shape);
		for (int i = compoundShape->getNumChildShapes() - 1; i >= 0; i--)
		{
			cbtTransform childTrans = compoundShape->getChildTransform(i);
			const cbtCollisionShape* colShape = compoundShape->getChildShape(i);
			debugDrawObject(worldTransform * childTrans, colShape, color);
		}
	}
	else
	{
		switch (shape->getShapeType())
		{
			case CE_TRIANGLE_SHAPE_PROXYTYPE:	// ***CHRONO***
			{
				const cbtCEtriangleShape* triShape = static_cast<const cbtCEtriangleShape*>(shape);
				chrono::ChVector<>* v1 = triShape->get_p1();
				chrono::ChVector<>* v2 = triShape->get_p2();
				chrono::ChVector<>* v3 = triShape->get_p3();
				auto origin = worldTransform.getOrigin();
				auto vt1 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v1->x(), (cbtScalar)v1->y(), (cbtScalar)v1->z());
				auto vt2 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v2->x(), (cbtScalar)v2->y(), (cbtScalar)v2->z());
				auto vt3 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v3->x(), (cbtScalar)v3->y(), (cbtScalar)v3->z());
				getDebugDrawer()->drawTriangle(vt1, vt2, vt3,color,1);
				break;
			}
			case BOX_SHAPE_PROXYTYPE:
			{
				const cbtBoxShape* boxShape = static_cast<const cbtBoxShape*>(shape);
				cbtVector3 halfExtents = boxShape->getHalfExtentsWithMargin();
				getDebugDrawer()->drawBox(-halfExtents, halfExtents, worldTransform, color);
				break;
			}

			case SPHERE_SHAPE_PROXYTYPE:
			{
				const cbtSphereShape* sphereShape = static_cast<const cbtSphereShape*>(shape);
				cbtScalar radius = sphereShape->getMargin();  //radius doesn't include the margin, so draw with margin

				getDebugDrawer()->drawSphere(radius, worldTransform, color);
				break;
			}
			case MULTI_SPHERE_SHAPE_PROXYTYPE:
			{
				const cbtMultiSphereShape* multiSphereShape = static_cast<const cbtMultiSphereShape*>(shape);

				cbtTransform childTransform;
				childTransform.setIdentity();

				for (int i = multiSphereShape->getSphereCount() - 1; i >= 0; i--)
				{
					childTransform.setOrigin(multiSphereShape->getSpherePosition(i));
					getDebugDrawer()->drawSphere(multiSphereShape->getSphereRadius(i), worldTransform * childTransform, color);
				}

				break;
			}
			case CAPSULE_SHAPE_PROXYTYPE:
			{
				const cbtCapsuleShape* capsuleShape = static_cast<const cbtCapsuleShape*>(shape);

				cbtScalar radius = capsuleShape->getRadius();
				cbtScalar halfHeight = capsuleShape->getHalfHeight();

				int upAxis = capsuleShape->getUpAxis();
				getDebugDrawer()->drawCapsule(radius, halfHeight, upAxis, worldTransform, color);
				break;
			}
			case CONE_SHAPE_PROXYTYPE:
			{
				const cbtConeShape* coneShape = static_cast<const cbtConeShape*>(shape);
				cbtScalar radius = coneShape->getRadius();  //+coneShape->getMargin();
				cbtScalar height = coneShape->getHeight();  //+coneShape->getMargin();

				int upAxis = coneShape->getConeUpIndex();
				getDebugDrawer()->drawCone(radius, height, upAxis, worldTransform, color);
				break;
			}
			case CYLINDER_SHAPE_PROXYTYPE:
			{
				const cbtCylinderShape* cylinder = static_cast<const cbtCylinderShape*>(shape);
				int upAxis = cylinder->getUpAxis();
				cbtScalar radius = cylinder->getRadius();
				cbtScalar halfHeight = cylinder->getHalfExtentsWithMargin()[upAxis];
				getDebugDrawer()->drawCylinder(radius, halfHeight, upAxis, worldTransform, color);
				break;
			}
            case CYLSHELL_SHAPE_PROXYTYPE: { /* ***CHRONO*** */
                const cbtCylindricalShellShape* cylinder = static_cast<const cbtCylindricalShellShape*>(shape);
				cbtScalar radius = cylinder->getRadius();
                cbtScalar halfHeight = cylinder->getHalfExtentsWithMargin()[1];
                getDebugDrawer()->drawCylinder(radius, halfHeight, 1, worldTransform, color);
                break;
            }
			case STATIC_PLANE_PROXYTYPE:
			{
				const cbtStaticPlaneShape* staticPlaneShape = static_cast<const cbtStaticPlaneShape*>(shape);
				cbtScalar planeConst = staticPlaneShape->getPlaneConstant();
				const cbtVector3& planeNormal = staticPlaneShape->getPlaneNormal();
				getDebugDrawer()->drawPlane(planeNormal, planeConst, worldTransform, color);
				break;
			}
			default:
			{
				/// for polyhedral shapes
				if (shape->isPolyhedral())
				{
					cbtPolyhedralConvexShape* polyshape = (cbtPolyhedralConvexShape*)shape;

					int i;
					if (polyshape->getConvexPolyhedron())
					{
						const cbtConvexPolyhedron* poly = polyshape->getConvexPolyhedron();
						for (i = 0; i < poly->m_faces.size(); i++)
						{
							cbtVector3 centroid(0, 0, 0);
							int numVerts = poly->m_faces[i].m_indices.size();
							if (numVerts)
							{
								int lastV = poly->m_faces[i].m_indices[numVerts - 1];
								for (int v = 0; v < poly->m_faces[i].m_indices.size(); v++)
								{
									int curVert = poly->m_faces[i].m_indices[v];
									centroid += poly->m_vertices[curVert];
									getDebugDrawer()->drawLine(worldTransform * poly->m_vertices[lastV], worldTransform * poly->m_vertices[curVert], color);
									lastV = curVert;
								}
							}
							centroid *= cbtScalar(1.f) / cbtScalar(numVerts);
							if (getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawNormals)
							{
								cbtVector3 normalColor(1, 1, 0);
								cbtVector3 faceNormal(poly->m_faces[i].m_plane[0], poly->m_faces[i].m_plane[1], poly->m_faces[i].m_plane[2]);
								getDebugDrawer()->drawLine(worldTransform * centroid, worldTransform * (centroid + faceNormal), normalColor);
							}
						}
					}
					else
					{
						for (i = 0; i < polyshape->getNumEdges(); i++)
						{
							cbtVector3 a, b;
							polyshape->getEdge(i, a, b);
							cbtVector3 wa = worldTransform * a;
							cbtVector3 wb = worldTransform * b;
							getDebugDrawer()->drawLine(wa, wb, color);
						}
					}
				}

				if (shape->isConcave())
				{
					cbtConcaveShape* concaveMesh = (cbtConcaveShape*)shape;

					///@todo pass camera, for some culling? no -> we are not a graphics lib
					cbtVector3 aabbMax(cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT));
					cbtVector3 aabbMin(cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT));

					DebugDrawcallback drawCallback(getDebugDrawer(), worldTransform, color);
					concaveMesh->processAllTriangles(&drawCallback, aabbMin, aabbMax);
				}

				if (shape->getShapeType() == CONVEX_TRIANGLEMESH_SHAPE_PROXYTYPE)
				{
					cbtConvexTriangleMeshShape* convexMesh = (cbtConvexTriangleMeshShape*)shape;
					//todo: pass camera for some culling
					cbtVector3 aabbMax(cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT));
					cbtVector3 aabbMin(cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT));
					//DebugDrawcallback drawCallback;
					DebugDrawcallback drawCallback(getDebugDrawer(), worldTransform, color);
					convexMesh->getMeshInterface()->InternalProcessAllTriangles(&drawCallback, aabbMin, aabbMax);
				}
			}
		}
	}
}